

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_BufferManager.cc
# Opt level: O2

MyDB_PageHandle __thiscall
MyDB_BufferManager::getPage(MyDB_BufferManager *this,MyDB_TablePtr *table,long index)

{
  undefined8 *puVar1;
  iterator iVar2;
  MyDB_PageBase *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  MyDB_PageHandle MVar3;
  pair<std::shared_ptr<MyDB_Table>,_long> curId;
  pair<std::shared_ptr<MyDB_Table>,_long> local_60;
  pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*> local_48;
  
  std::make_shared<MyDB_PageHandleBase>();
  std::__shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2> *)&curId,
             (__shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2> *)index);
  iVar2 = std::
          _Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,_long>,_std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>,_std::_Select1st<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>_>
          ::find((_Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,_long>,_std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>,_std::_Select1st<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>_>
                  *)table,&curId);
  if (iVar2._M_node ==
      (_Base_ptr)&(table->super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>)._M_refcount) {
    this_00 = (MyDB_PageBase *)operator_new(0x38);
    std::pair<std::shared_ptr<MyDB_Table>,_long>::pair(&local_60,&curId);
    MyDB_PageBase::MyDB_PageBase
              (this_00,(void *)0x0,false,0xffffffffffffffff,false,0,&local_60,
               (MyDB_BufferManager *)table);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::pair<std::shared_ptr<MyDB_Table>,_long>::pair(&local_48.first,&curId);
    local_48.second = this_00;
    std::
    _Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,long>,std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>,std::_Select1st<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>>,std::less<std::pair<std::shared_ptr<MyDB_Table>,long>>,std::allocator<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>>>
    ::_M_insert_unique<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>>
              ((_Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,long>,std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>,std::_Select1st<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>>,std::less<std::pair<std::shared_ptr<MyDB_Table>,long>>,std::allocator<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,MyDB_PageBase*>>>
                *)table,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    this_00 = (MyDB_PageBase *)iVar2._M_node[1]._M_right;
  }
  puVar1 = *(undefined8 **)&(this->pageMap)._M_t._M_impl;
  *puVar1 = this_00;
  this_00->handleCount = this_00->handleCount + 1;
  puVar1[1] = table;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  MVar3.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar3.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MyDB_PageHandle)MVar3.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MyDB_PageHandle MyDB_BufferManager :: getPage (MyDB_TablePtr table, long index) {
	// the handle we will return
	MyDB_PageHandle phd = make_shared<MyDB_PageHandleBase>();
	// Find if this page is in the buffer
	pair<MyDB_TablePtr, long> curId(table, index);
	map<pair<MyDB_TablePtr, long>, MyDB_PageBase*>:: iterator it_pageMap = pageMap.find(curId);

	//If find this page in buffer
	if (it_pageMap != pageMap.end()) {
		phd -> pagePtr = it_pageMap -> second;
	}

	//If this page is in the disk and we need to put it in the buffer
	else {
		//New one page with null buffer address
		MyDB_PageBase* newPage = new MyDB_PageBase (nullptr, false, -1, false, 0, curId, this);
		// Update pageMap
		pageMap.insert(map<pair<MyDB_TablePtr, long>, MyDB_PageBase*>::value_type(curId, newPage));
		phd -> pagePtr = newPage;
	}

	//Update the handleCount of this page and add this new handle's buffer information
	phd -> pagePtr -> handleCount ++;
	phd->bufferManager = this;
	return phd;

}